

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O0

_Bool getPrimaries(khr_df_primaries_e primaries,Primaries *p)

{
  float fVar1;
  ulong uVar2;
  uint i;
  Primaries *p_local;
  khr_df_primaries_e primaries_local;
  
  i = 0;
  while( true ) {
    if (10 < i) {
      return false;
    }
    if (primaryMap[i].dfPrimaryEnum == primaries) break;
    i = i + 1;
  }
  uVar2 = (ulong)i;
  fVar1 = primaryMap[uVar2].primaries.Ry;
  p->Rx = primaryMap[uVar2].primaries.Rx;
  p->Ry = fVar1;
  fVar1 = primaryMap[uVar2].primaries.Gy;
  p->Gx = primaryMap[uVar2].primaries.Gx;
  p->Gy = fVar1;
  fVar1 = primaryMap[uVar2].primaries.By;
  p->Bx = primaryMap[uVar2].primaries.Bx;
  p->By = fVar1;
  fVar1 = primaryMap[uVar2].primaries.Wy;
  p->Wx = primaryMap[uVar2].primaries.Wx;
  p->Wy = fVar1;
  return true;
}

Assistant:

bool getPrimaries(khr_df_primaries_e primaries, Primaries *p) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].dfPrimaryEnum == primaries) {
            *p = primaryMap[i].primaries;
            return true;
        }
    }

    /* No match */
    return false;
}